

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O0

RK_S32 pred_weight_table(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  int local_bc;
  RK_S32 local_b8;
  RK_S32 _out_13;
  RK_S32 _out_12;
  RK_S32 delta_chroma_offset_l1;
  RK_S32 delta_chroma_weight_l1;
  RK_S32 _out_11;
  RK_U32 _out_10;
  RK_S32 delta_luma_weight_l1;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_S32 _out_7;
  RK_S32 _out_6;
  RK_S32 delta_chroma_offset_l0;
  RK_S32 delta_chroma_weight_l0;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 delta_luma_weight_l0;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 delta;
  RK_U32 _out;
  RK_U8 chroma_weight_l1_flag [16];
  RK_U8 luma_weight_l1_flag [16];
  RK_U8 chroma_weight_l0_flag [16];
  RK_U8 luma_weight_l0_flag [16];
  RK_U32 j;
  RK_U32 i;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  MVar1 = mpp_read_ue(gb,(RK_U32 *)&_out_1);
  gb->ret = MVar1;
  if (gb->ret == MPP_OK) {
    (s->sh).luma_log2_weight_denom = (RK_U8)_out_1;
    if (s->sps->chroma_format_idc != 0) {
      _out_2 = 0;
      MVar1 = mpp_read_se(gb,&_out_3);
      gb->ret = MVar1;
      if (gb->ret != MPP_OK) goto LAB_001dc944;
      _out_2 = _out_3;
      RVar2 = mpp_clip((uint)(s->sh).luma_log2_weight_denom + _out_3,0,7);
      (s->sh).chroma_log2_weight_denom = (RK_S16)RVar2;
    }
    luma_weight_l0_flag[0xc] = '\0';
    luma_weight_l0_flag[0xd] = '\0';
    luma_weight_l0_flag[0xe] = '\0';
    luma_weight_l0_flag[0xf] = '\0';
    for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[0];
        luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
      MVar1 = mpp_read_bits(gb,1,&delta_luma_weight_l0);
      gb->ret = MVar1;
      if (gb->ret != MPP_OK) goto LAB_001dc944;
      chroma_weight_l0_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] =
           (RK_U8)delta_luma_weight_l0;
      if (chroma_weight_l0_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] == '\0') {
        (s->sh).luma_weight_l0[(uint)luma_weight_l0_flag._12_4_] =
             (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
        (s->sh).luma_offset_l0[(uint)luma_weight_l0_flag._12_4_] = 0;
      }
    }
    if (s->sps->chroma_format_idc == 0) {
      luma_weight_l0_flag[0xc] = '\0';
      luma_weight_l0_flag[0xd] = '\0';
      luma_weight_l0_flag[0xe] = '\0';
      luma_weight_l0_flag[0xf] = '\0';
      for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[0];
          luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
        luma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] = '\0';
      }
    }
    else {
      luma_weight_l0_flag[0xc] = '\0';
      luma_weight_l0_flag[0xd] = '\0';
      luma_weight_l0_flag[0xe] = '\0';
      luma_weight_l0_flag[0xf] = '\0';
      for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[0];
          luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
        MVar1 = mpp_read_bits(gb,1,&_out_4);
        gb->ret = MVar1;
        if (gb->ret != MPP_OK) goto LAB_001dc944;
        luma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] = (RK_U8)_out_4;
      }
    }
    luma_weight_l0_flag[0xc] = '\0';
    luma_weight_l0_flag[0xd] = '\0';
    luma_weight_l0_flag[0xe] = '\0';
    luma_weight_l0_flag[0xf] = '\0';
    for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[0];
        luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
      if (chroma_weight_l0_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] != '\0') {
        _out_5 = 0;
        MVar1 = mpp_read_se(gb,&delta_chroma_weight_l0);
        gb->ret = MVar1;
        if (gb->ret != MPP_OK) goto LAB_001dc944;
        _out_5 = delta_chroma_weight_l0;
        (s->sh).luma_weight_l0[(uint)luma_weight_l0_flag._12_4_] =
             (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)delta_chroma_weight_l0;
        MVar1 = mpp_read_se(gb,&delta_chroma_offset_l0);
        gb->ret = MVar1;
        if (gb->ret != MPP_OK) goto LAB_001dc944;
        (s->sh).luma_offset_l0[(uint)luma_weight_l0_flag._12_4_] = (RK_S16)delta_chroma_offset_l0;
      }
      if (luma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] == '\0') {
        (s->sh).chroma_weight_l0[(uint)luma_weight_l0_flag._12_4_][0] =
             (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
        (s->sh).chroma_offset_l0[(uint)luma_weight_l0_flag._12_4_][0] = 0;
        (s->sh).chroma_weight_l0[(uint)luma_weight_l0_flag._12_4_][1] =
             (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
        (s->sh).chroma_offset_l0[(uint)luma_weight_l0_flag._12_4_][1] = 0;
      }
      else {
        luma_weight_l0_flag[8] = '\0';
        luma_weight_l0_flag[9] = '\0';
        luma_weight_l0_flag[10] = '\0';
        luma_weight_l0_flag[0xb] = '\0';
        for (; (uint)luma_weight_l0_flag._8_4_ < 2;
            luma_weight_l0_flag._8_4_ = luma_weight_l0_flag._8_4_ + 1) {
          _out_6 = 0;
          _out_7 = 0;
          MVar1 = mpp_read_se(gb,&_out_8);
          gb->ret = MVar1;
          if (gb->ret != MPP_OK) goto LAB_001dc944;
          _out_6 = _out_8;
          MVar1 = mpp_read_se(gb,&_out_9);
          gb->ret = MVar1;
          if (gb->ret != MPP_OK) goto LAB_001dc944;
          _out_7 = _out_9;
          (s->sh).chroma_weight_l0[(uint)luma_weight_l0_flag._12_4_]
          [(uint)luma_weight_l0_flag._8_4_] =
               (short)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f)) + (short)_out_6;
          RVar2 = mpp_clip((_out_9 - (((int)(s->sh).chroma_weight_l0
                                            [(uint)luma_weight_l0_flag._12_4_]
                                            [(uint)luma_weight_l0_flag._8_4_] << 7) >>
                                     ((byte)(s->sh).chroma_log2_weight_denom & 0x1f))) + 0x80,-0x80,
                           0x7f);
          (s->sh).chroma_offset_l0[(uint)luma_weight_l0_flag._12_4_]
          [(uint)luma_weight_l0_flag._8_4_] = (RK_S16)RVar2;
        }
      }
    }
    if ((s->sh).slice_type == B_SLICE) {
      luma_weight_l0_flag[0xc] = '\0';
      luma_weight_l0_flag[0xd] = '\0';
      luma_weight_l0_flag[0xe] = '\0';
      luma_weight_l0_flag[0xf] = '\0';
      for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[1];
          luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
        MVar1 = mpp_read_bits(gb,1,&delta_luma_weight_l1);
        gb->ret = MVar1;
        if (gb->ret != MPP_OK) goto LAB_001dc944;
        chroma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] =
             (RK_U8)delta_luma_weight_l1;
        if (chroma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] == '\0') {
          (s->sh).luma_weight_l1[(uint)luma_weight_l0_flag._12_4_] =
               (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
          (s->sh).luma_offset_l1[(uint)luma_weight_l0_flag._12_4_] = 0;
        }
      }
      if (s->sps->chroma_format_idc == 0) {
        luma_weight_l0_flag[0xc] = '\0';
        luma_weight_l0_flag[0xd] = '\0';
        luma_weight_l0_flag[0xe] = '\0';
        luma_weight_l0_flag[0xf] = '\0';
        for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[1];
            luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
          *(undefined1 *)((long)&delta + (ulong)(uint)luma_weight_l0_flag._12_4_) = 0;
        }
      }
      else {
        luma_weight_l0_flag[0xc] = '\0';
        luma_weight_l0_flag[0xd] = '\0';
        luma_weight_l0_flag[0xe] = '\0';
        luma_weight_l0_flag[0xf] = '\0';
        for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[1];
            luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
          MVar1 = mpp_read_bits(gb,1,(RK_S32 *)&_out_10);
          gb->ret = MVar1;
          if (gb->ret != MPP_OK) goto LAB_001dc944;
          *(char *)((long)&delta + (ulong)(uint)luma_weight_l0_flag._12_4_) = (char)_out_10;
        }
      }
      luma_weight_l0_flag[0xc] = '\0';
      luma_weight_l0_flag[0xd] = '\0';
      luma_weight_l0_flag[0xe] = '\0';
      luma_weight_l0_flag[0xf] = '\0';
      for (; (uint)luma_weight_l0_flag._12_4_ < (s->sh).nb_refs[1];
          luma_weight_l0_flag._12_4_ = luma_weight_l0_flag._12_4_ + 1) {
        if (chroma_weight_l1_flag[(ulong)(uint)luma_weight_l0_flag._12_4_ + 8] != '\0') {
          _out_11 = 0;
          MVar1 = mpp_read_ue(gb,(RK_U32 *)&delta_chroma_weight_l1);
          gb->ret = MVar1;
          if (gb->ret != MPP_OK) goto LAB_001dc944;
          _out_11 = delta_chroma_weight_l1;
          (s->sh).luma_weight_l1[(uint)luma_weight_l0_flag._12_4_] =
               (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)delta_chroma_weight_l1
          ;
          MVar1 = mpp_read_se(gb,&delta_chroma_offset_l1);
          gb->ret = MVar1;
          if (gb->ret != MPP_OK) goto LAB_001dc944;
          (s->sh).luma_offset_l1[(uint)luma_weight_l0_flag._12_4_] = (RK_S16)delta_chroma_offset_l1;
        }
        if (*(char *)((long)&delta + (ulong)(uint)luma_weight_l0_flag._12_4_) == '\0') {
          (s->sh).chroma_weight_l1[(uint)luma_weight_l0_flag._12_4_][0] =
               (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
          (s->sh).chroma_offset_l1[(uint)luma_weight_l0_flag._12_4_][0] = 0;
          (s->sh).chroma_weight_l1[(uint)luma_weight_l0_flag._12_4_][1] =
               (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
          *(undefined2 *)((long)s->rps[0].ref + (ulong)(uint)luma_weight_l0_flag._12_4_ * 4 + -0x46)
               = 0;
        }
        else {
          luma_weight_l0_flag[8] = '\0';
          luma_weight_l0_flag[9] = '\0';
          luma_weight_l0_flag[10] = '\0';
          luma_weight_l0_flag[0xb] = '\0';
          for (; (uint)luma_weight_l0_flag._8_4_ < 2;
              luma_weight_l0_flag._8_4_ = luma_weight_l0_flag._8_4_ + 1) {
            _out_12 = 0;
            _out_13 = 0;
            MVar1 = mpp_read_se(gb,&local_b8);
            gb->ret = MVar1;
            if (gb->ret != MPP_OK) goto LAB_001dc944;
            _out_12 = local_b8;
            MVar1 = mpp_read_se(gb,&local_bc);
            gb->ret = MVar1;
            if (gb->ret != MPP_OK) goto LAB_001dc944;
            _out_13 = local_bc;
            (s->sh).chroma_weight_l1[(uint)luma_weight_l0_flag._12_4_]
            [(uint)luma_weight_l0_flag._8_4_] =
                 (short)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f)) + (short)_out_12;
            RVar2 = mpp_clip((local_bc -
                             (((int)(s->sh).chroma_weight_l1[(uint)luma_weight_l0_flag._12_4_]
                                    [(uint)luma_weight_l0_flag._8_4_] << 7) >>
                             ((byte)(s->sh).chroma_log2_weight_denom & 0x1f))) + 0x80,-0x80,0x7f);
            (s->sh).chroma_offset_l1[(uint)luma_weight_l0_flag._12_4_]
            [(uint)luma_weight_l0_flag._8_4_] = (RK_S16)RVar2;
          }
        }
      }
    }
    s_local._4_4_ = 0;
  }
  else {
LAB_001dc944:
    s_local._4_4_ = -0x3ec;
  }
  return s_local._4_4_;
}

Assistant:

static MPP_RET pred_weight_table(H264_SLICE_t *currSlice)
{
    RK_S32 se_tmp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0, j = 0, temp = 0;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;

    READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    if (currSlice->active_sps->chroma_format_idc) {
        READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    }
    for (i = 0; i < currSlice->num_ref_idx_active[LIST_0]; i++) {
        READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l0
        if (temp) {
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][0]
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][0]
        }
        if (currSlice->active_sps->chroma_format_idc) {
            READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l0
            for (j = 1; j < 3; j++) {
                if (temp) { //!< chroma_weight_flag_l0
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][j]
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][j]
                }
            }
        }
    }

    if ((currSlice->slice_type == H264_B_SLICE) && currSlice->p_Vid->active_pps->weighted_bipred_idc == 1) {
        for (i = 0; i < currSlice->num_ref_idx_active[LIST_1]; i++) {
            READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l1
            if (temp) {
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][0]
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][0]
            }
            if (currSlice->active_sps->chroma_format_idc) {
                READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l1
                for (j = 1; j < 3; j++) {
                    if (temp) { // chroma_weight_flag_l1
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][j]
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][j]
                    }
                }
            }
        }
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    return ret = p_bitctx->ret;
}